

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidateElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  xmlAttrPtr attr;
  xmlNodePtr elem_00;
  uint uVar1;
  uint uVar2;
  xmlChar *pxVar3;
  _xmlAttr **pp_Var4;
  xmlNsPtr ns;
  _xmlNode **pp_Var5;
  
  uVar1 = 0;
  if (elem != (xmlNodePtr)0x0) {
    uVar1 = 1;
    if ((((2 < elem->type - XML_NAMESPACE_DECL) && (uVar1 = 0, doc != (xmlDocPtr)0x0)) &&
        ((doc->intSubset != (_xmlDtd *)0x0 || (uVar1 = 0, doc->extSubset != (_xmlDtd *)0x0)))) &&
       (uVar1 = 1, elem->type != XML_ENTITY_REF_NODE)) {
      uVar1 = xmlValidateOneElement(ctxt,doc,elem);
      uVar1 = uVar1 & 1;
      if (elem->type == XML_ELEMENT_NODE) {
        pp_Var4 = &elem->properties;
        while (attr = *pp_Var4, attr != (xmlAttrPtr)0x0) {
          pxVar3 = xmlNodeListGetString(doc,attr->children,0);
          uVar2 = xmlValidateOneAttribute(ctxt,doc,elem,attr,pxVar3);
          if (pxVar3 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar3);
          }
          uVar1 = uVar1 & uVar2;
          pp_Var4 = &attr->next;
        }
        ns = (xmlNsPtr)&elem->nsDef;
        while (ns = ns->next, ns != (xmlNsPtr)0x0) {
          if (elem->ns == (xmlNs *)0x0) {
            pxVar3 = (xmlChar *)0x0;
          }
          else {
            pxVar3 = elem->ns->prefix;
          }
          uVar2 = xmlValidateOneNamespace(ctxt,doc,elem,pxVar3,ns,ns->href);
          uVar1 = uVar1 & uVar2;
        }
      }
      pp_Var5 = &elem->children;
      while (elem_00 = *pp_Var5, elem_00 != (xmlNodePtr)0x0) {
        uVar2 = xmlValidateElement(ctxt,doc,elem_00);
        uVar1 = uVar1 & uVar2;
        pp_Var5 = &elem_00->next;
      }
    }
  }
  return uVar1;
}

Assistant:

int
xmlValidateElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc, xmlNodePtr elem) {
    xmlNodePtr child;
    xmlAttrPtr attr;
    xmlNsPtr ns;
    const xmlChar *value;
    int ret = 1;

    if (elem == NULL) return(0);

    /*
     * XInclude elements were added after parsing in the infoset,
     * they don't really mean anything validation wise.
     */
    if ((elem->type == XML_XINCLUDE_START) ||
	(elem->type == XML_XINCLUDE_END) ||
	(elem->type == XML_NAMESPACE_DECL))
	return(1);

    CHECK_DTD;

    /*
     * Entities references have to be handled separately
     */
    if (elem->type == XML_ENTITY_REF_NODE) {
	return(1);
    }

    ret &= xmlValidateOneElement(ctxt, doc, elem);
    if (elem->type == XML_ELEMENT_NODE) {
	attr = elem->properties;
	while (attr != NULL) {
	    value = xmlNodeListGetString(doc, attr->children, 0);
	    ret &= xmlValidateOneAttribute(ctxt, doc, elem, attr, value);
	    if (value != NULL)
		xmlFree((char *)value);
	    attr= attr->next;
	}
	ns = elem->nsDef;
	while (ns != NULL) {
	    if (elem->ns == NULL)
		ret &= xmlValidateOneNamespace(ctxt, doc, elem, NULL,
					       ns, ns->href);
	    else
		ret &= xmlValidateOneNamespace(ctxt, doc, elem,
		                               elem->ns->prefix, ns, ns->href);
	    ns = ns->next;
	}
    }
    child = elem->children;
    while (child != NULL) {
        ret &= xmlValidateElement(ctxt, doc, child);
        child = child->next;
    }

    return(ret);
}